

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_33808::
ARTCorrectnessTest_Node48KeyPrefixMerge_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_Node48KeyPrefixMerge_Test
          (ARTCorrectnessTest_Node48KeyPrefixMerge_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node48KeyPrefixMerge) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(10, 17);
  // Insert a value that does not share full prefix with the current Node48
  verifier.insert(0x2010, unodb::test::test_values[1]);
#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({18, 1, 0, 1, 0});
#endif  // UNODB_DETAIL_WITH_STATS

  // And delete it, so that upper level Node4 key prefix gets merged with
  // Node48 one
  unodb::test::must_not_allocate([&verifier] { verifier.remove(0x2010); });

  verifier.check_present_values();
  verifier.check_absent_keys({9, 0x2010, 28});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_shrinking_inodes({1, 0, 0, 0});
  verifier.assert_node_counts({17, 0, 0, 1, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}